

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

Stream * rw::wdgl::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  uint32 uVar1;
  undefined4 *puVar2;
  void *pvVar3;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  puVar2 = (undefined4 *)
           mustmalloc_LOC(0x28,0x3000f,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 253"
                         );
  *(undefined4 **)((long)object + 0x98) = puVar2;
  *puVar2 = 0xb;
  puVar2[8] = 0;
  puVar2[9] = 0;
  uVar1 = Stream::readU32(stream);
  puVar2[1] = uVar1;
  pvVar3 = mustmalloc_LOC((long)(int)puVar2[1] * 0x18,0x3000f,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 259"
                         );
  *(void **)(puVar2 + 2) = pvVar3;
  Stream::read32(stream,*(void **)(puVar2 + 2),puVar2[1] * 0x18);
  puVar2[4] = *(int *)(*(long *)(puVar2 + 2) + 0x10) * *(int *)((long)object + 0x1c);
  pvVar3 = mustmalloc_LOC((ulong)(uint)puVar2[4],0x3000f,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 263"
                         );
  *(void **)(puVar2 + 6) = pvVar3;
  (*stream->_vptr_Stream[4])(stream,*(undefined8 *)(puVar2 + 6),(ulong)(uint)puVar2[4]);
  return stream;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_WDGL;
	header->vbo = 0;
	header->ibo = 0;
	header->numAttribs = stream->readU32();
	header->attribs = rwNewT(AttribDesc, header->numAttribs, MEMDUR_EVENT | ID_GEOMETRY);
	stream->read32(header->attribs,
	            header->numAttribs*sizeof(AttribDesc));
	header->dataSize = header->attribs[0].stride*geometry->numVertices;
	header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	ASSERTLITTLE;
	stream->read8(header->data, header->dataSize);
	return stream;
}